

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::addDependency
          (CommonCore *this,LocalFederateId federateID,string_view federateName)

{
  FederateState *pFVar1;
  InvalidIdentifier *this_00;
  string_view message;
  ActionMessage search;
  
  pFVar1 = getFederateAt(this,federateID);
  if (pFVar1 != (FederateState *)0x0) {
    ActionMessage::ActionMessage(&search,cmd_search_dependency);
    search.source_id.gid = (pFVar1->global_id)._M_i.gid;
    ActionMessage::name(&search,federateName);
    BrokerBase::addActionMessage(&this->super_BrokerBase,&search);
    ActionMessage::~ActionMessage(&search);
    return;
  }
  this_00 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
  message._M_str = "federateID not valid (addDependency)";
  message._M_len = 0x24;
  InvalidIdentifier::InvalidIdentifier(this_00,message);
  __cxa_throw(this_00,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void CommonCore::addDependency(LocalFederateId federateID, std::string_view federateName)
{
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid (addDependency)"));
    }
    ActionMessage search(CMD_SEARCH_DEPENDENCY);
    search.source_id = fed->global_id.load();
    search.name(federateName);
    addActionMessage(std::move(search));
}